

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  uv_stream_t *unaff_RBX;
  void *pvVar5;
  uv_loop_t *puVar6;
  undefined1 *puVar7;
  undefined1 auStack_120 [248];
  uv_stream_t *puStack_28;
  code *pcStack_20;
  
  if (status == 0) {
    puVar6 = (uv_loop_t *)0xf8;
    pcStack_20 = (code *)0x172b37;
    pvVar2 = malloc(0xf8);
    unaff_RBX = server;
    if (pvVar2 == (void *)0x0) goto LAB_00172b89;
    puVar6 = server->loop;
    pcStack_20 = (code *)0x172b50;
    pvVar5 = pvVar2;
    iVar1 = uv_tcp_init_ex(puVar6,pvVar2,2);
    status = (int)pvVar5;
    if (iVar1 != 0) goto LAB_00172b8e;
    pcStack_20 = (code *)0x172b5f;
    pvVar5 = pvVar2;
    puVar6 = (uv_loop_t *)server;
    iVar1 = uv_accept();
    status = (int)pvVar5;
    if (iVar1 == -0x10) {
      pcStack_20 = (code *)0x172b6e;
      uv_close(server,0);
      uv_close(pvVar2,free);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x172b89;
    on_connection_cold_1();
    puVar6 = (uv_loop_t *)server;
LAB_00172b89:
    pcStack_20 = (code *)0x172b8e;
    on_connection_cold_4();
LAB_00172b8e:
    pcStack_20 = (code *)0x172b93;
    on_connection_cold_2();
  }
  pcStack_20 = on_connect;
  on_connection_cold_3();
  if (status == 0) {
    uv_close(puVar6->pending_queue[0],0);
    return;
  }
  puStack_28 = (uv_stream_t *)0x172bad;
  on_connect_cold_1();
  puStack_28 = unaff_RBX;
  puVar3 = (undefined1 *)uv_default_loop();
  puVar7 = puVar3;
  iVar1 = uv_tcp_init(puVar3,auStack_120);
  if (iVar1 == 0) {
    puVar7 = auStack_120;
    iVar1 = uv_tcp_nodelay(puVar7,1);
    if (iVar1 != 0) goto LAB_00172c5e;
    puVar7 = auStack_120;
    iVar1 = uv_tcp_keepalive(puVar7,1,0x3c);
    if (iVar1 != 0) goto LAB_00172c63;
    uv_close(auStack_120,0);
    iVar1 = uv_run(puVar3,0);
    if (iVar1 == 0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar3 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00172c6d;
    }
  }
  else {
    run_test_tcp_flags_cold_1();
LAB_00172c5e:
    run_test_tcp_flags_cold_2();
LAB_00172c63:
    puVar3 = puVar7;
    run_test_tcp_flags_cold_3();
  }
  run_test_tcp_flags_cold_4();
LAB_00172c6d:
  run_test_tcp_flags_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar3,0);
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* conn;
  int r;

  if (!local_conn_accepted) {
    /* Accept the connection and close it.  Also and close the server. */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    conn = malloc(sizeof(*conn));
    ASSERT(conn);
    r = uv_tcp_init(server->loop, conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)conn, close_server_conn_cb);
    uv_close((uv_handle_t*)server, NULL);
    local_conn_accepted = 1;
  }
}